

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_sse2.c
# Opt level: O2

void ConvertBGRAToRGB565_SSE2(uint32_t *src,int num_pixels,uint8_t *dst)

{
  undefined1 (*pauVar1) [16];
  uint uVar2;
  undefined1 uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 *puVar14;
  undefined1 (*pauVar15) [16];
  undefined1 (*pauVar16) [16];
  undefined1 (*pauVar17) [16];
  undefined1 (*pauVar18) [16];
  undefined1 (*pauVar19) [16];
  undefined1 (*pauVar20) [16];
  undefined1 (*pauVar21) [16];
  undefined1 (*pauVar22) [16];
  undefined1 (*pauVar23) [16];
  undefined1 (*pauVar24) [16];
  undefined1 (*pauVar25) [16];
  undefined1 (*pauVar26) [16];
  undefined1 (*pauVar27) [16];
  undefined1 (*pauVar28) [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  __m128i *out;
  __m128i *in;
  undefined1 auVar32 [15];
  undefined1 auVar33 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar50 [12];
  undefined1 auVar52 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar34 [16];
  undefined1 auVar43 [16];
  undefined1 auVar35 [16];
  undefined1 auVar44 [16];
  undefined1 auVar36 [16];
  undefined1 auVar45 [16];
  undefined1 auVar37 [16];
  undefined1 auVar46 [16];
  undefined1 auVar38 [16];
  undefined1 auVar47 [16];
  undefined1 auVar39 [16];
  undefined1 auVar48 [16];
  undefined1 auVar40 [16];
  undefined1 auVar49 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar51 [14];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  
  auVar31 = _DAT_00123d00;
  auVar30 = _DAT_00123cf0;
  auVar29 = _DAT_00123ce0;
  for (; 7 < num_pixels; num_pixels = num_pixels + -8) {
    auVar41 = *(undefined1 (*) [16])src;
    pauVar1 = (undefined1 (*) [16])((long)src + 0x10);
    pauVar15 = (undefined1 (*) [16])((long)src + 0x10);
    pauVar16 = (undefined1 (*) [16])((long)src + 0x10);
    uVar3 = (*(undefined1 (*) [16])((long)src + 0x10))[3];
    pauVar17 = (undefined1 (*) [16])((long)src + 0x10);
    pauVar18 = (undefined1 (*) [16])((long)src + 0x10);
    pauVar19 = (undefined1 (*) [16])((long)src + 0x10);
    pauVar20 = (undefined1 (*) [16])((long)src + 0x10);
    pauVar21 = (undefined1 (*) [16])((long)src + 0x10);
    pauVar22 = (undefined1 (*) [16])((long)src + 0x10);
    pauVar23 = (undefined1 (*) [16])((long)src + 0x10);
    pauVar24 = (undefined1 (*) [16])((long)src + 0x10);
    pauVar25 = (undefined1 (*) [16])((long)src + 0x10);
    pauVar26 = (undefined1 (*) [16])((long)src + 0x10);
    pauVar27 = (undefined1 (*) [16])((long)src + 0x10);
    pauVar28 = (undefined1 (*) [16])((long)src + 0x10);
    src = (uint32_t *)((long)src + 0x20);
    auVar69._0_14_ = auVar41._0_14_;
    auVar69[0xe] = auVar41[7];
    auVar69[0xf] = (*pauVar20)[7];
    auVar68._14_2_ = auVar69._14_2_;
    auVar68._0_13_ = auVar41._0_13_;
    auVar68[0xd] = (*pauVar19)[6];
    auVar67._13_3_ = auVar68._13_3_;
    auVar67._0_12_ = auVar41._0_12_;
    auVar67[0xc] = auVar41[6];
    auVar66._12_4_ = auVar67._12_4_;
    auVar66._0_11_ = auVar41._0_11_;
    auVar66[0xb] = (*pauVar18)[5];
    auVar65._11_5_ = auVar66._11_5_;
    auVar65._0_10_ = auVar41._0_10_;
    auVar65[10] = auVar41[5];
    auVar64._10_6_ = auVar65._10_6_;
    auVar64._0_9_ = auVar41._0_9_;
    auVar64[9] = (*pauVar17)[4];
    auVar63._9_7_ = auVar64._9_7_;
    auVar63._0_8_ = auVar41._0_8_;
    auVar63[8] = auVar41[4];
    auVar8._1_8_ = auVar63._8_8_;
    auVar8[0] = uVar3;
    auVar8._9_7_ = 0;
    auVar7._10_6_ = 0;
    auVar7._0_10_ = SUB1610(auVar8 << 0x38,6);
    auVar6._11_5_ = 0;
    auVar6._0_11_ = SUB1611(auVar7 << 0x30,5);
    auVar5._12_4_ = 0;
    auVar5._0_12_ = SUB1612(auVar6 << 0x28,4);
    auVar4._13_3_ = 0;
    auVar4._0_13_ = SUB1613(auVar5 << 0x20,3);
    auVar71._14_2_ = 0;
    auVar71._0_14_ = SUB1614(auVar4 << 0x18,2);
    auVar71 = auVar71 << 0x10;
    auVar59._0_14_ = auVar71._0_14_;
    auVar59[0xe] = uVar3;
    auVar59[0xf] = (*pauVar24)[0xb];
    auVar58._14_2_ = auVar59._14_2_;
    auVar58._0_13_ = auVar71._0_13_;
    auVar58[0xd] = auVar41[0xb];
    auVar57._13_3_ = auVar58._13_3_;
    auVar57._0_12_ = auVar71._0_12_;
    auVar57[0xc] = auVar41[3];
    auVar56._12_4_ = auVar57._12_4_;
    auVar56._0_11_ = auVar71._0_11_;
    auVar56[0xb] = (*pauVar23)[10];
    auVar55._11_5_ = auVar56._11_5_;
    auVar55._0_10_ = auVar71._0_10_;
    auVar55[10] = (*pauVar16)[2];
    auVar54._10_6_ = auVar55._10_6_;
    auVar54._0_9_ = auVar71._0_9_;
    auVar54[9] = auVar41[10];
    auVar53._9_7_ = auVar54._9_7_;
    auVar53._0_8_ = auVar71._0_8_;
    auVar53[8] = auVar41[2];
    auVar13._1_8_ = auVar53._8_8_;
    auVar13[0] = (*pauVar22)[9];
    auVar13._9_7_ = 0;
    auVar12._10_6_ = 0;
    auVar12._0_10_ = SUB1610(auVar13 << 0x38,6);
    auVar11._11_5_ = 0;
    auVar11._0_11_ = SUB1611(auVar12 << 0x30,5);
    auVar10._12_4_ = 0;
    auVar10._0_12_ = SUB1612(auVar11 << 0x28,4);
    auVar9._13_3_ = 0;
    auVar9._0_13_ = SUB1613(auVar10 << 0x20,3);
    auVar52._14_2_ = 0;
    auVar52._0_14_ = SUB1614(auVar9 << 0x18,2);
    auVar52 = auVar52 << 0x10;
    auVar40._0_14_ = auVar52._0_14_;
    auVar40[0xe] = (*pauVar22)[9];
    auVar40[0xf] = (*pauVar26)[0xd];
    auVar39._14_2_ = auVar40._14_2_;
    auVar39._0_13_ = auVar52._0_13_;
    auVar39[0xd] = (*pauVar18)[5];
    auVar38._13_3_ = auVar39._13_3_;
    auVar38._0_12_ = auVar52._0_12_;
    auVar38[0xc] = (*pauVar15)[1];
    auVar37._12_4_ = auVar38._12_4_;
    auVar37._0_11_ = auVar52._0_11_;
    auVar37[0xb] = auVar41[0xd];
    auVar36._11_5_ = auVar37._11_5_;
    auVar36._0_10_ = auVar52._0_10_;
    auVar36[10] = auVar41[9];
    auVar35._10_6_ = auVar36._10_6_;
    auVar35._0_9_ = auVar52._0_9_;
    auVar35[9] = auVar41[5];
    auVar34._9_7_ = auVar35._9_7_;
    auVar34._0_8_ = auVar52._0_8_;
    auVar34[8] = auVar41[1];
    auVar33._8_8_ = auVar34._8_8_;
    auVar33[7] = (*pauVar25)[0xc];
    auVar33[6] = (*pauVar21)[8];
    auVar33[5] = (*pauVar17)[4];
    auVar33[4] = (*pauVar1)[0];
    auVar33[3] = auVar41[0xc];
    auVar33[2] = auVar41[8];
    auVar33[1] = auVar41[4];
    auVar33[0] = auVar41[0];
    auVar61._0_8_ =
         CONCAT17((*pauVar27)[0xe],
                  CONCAT16((*pauVar23)[10],
                           CONCAT15((*pauVar19)[6],
                                    CONCAT14((*pauVar16)[2],
                                             CONCAT13(auVar41[0xe],
                                                      CONCAT12(auVar41[10],
                                                               CONCAT11(auVar41[6],auVar41[2])))))))
    ;
    auVar50._0_10_ = CONCAT19(auVar41[7],CONCAT18(auVar41[3],auVar61._0_8_));
    auVar50[10] = auVar41[0xb];
    auVar50[0xb] = auVar41[0xf];
    auVar51[0xc] = uVar3;
    auVar51._0_12_ = auVar50;
    auVar51[0xd] = (*pauVar20)[7];
    auVar60[0xe] = (*pauVar24)[0xb];
    auVar60._0_14_ = auVar51;
    auVar60[0xf] = (*pauVar28)[0xf];
    auVar70._8_8_ = auVar60._8_8_;
    auVar70._0_8_ = auVar33._8_8_;
    auVar61._8_8_ = auVar33._0_8_;
    auVar61 = auVar61 & auVar29;
    auVar41._0_2_ = auVar34._8_2_ >> 5;
    auVar41._2_2_ = auVar36._10_2_ >> 5;
    auVar41._4_2_ = auVar38._12_2_ >> 5;
    auVar41._6_2_ = auVar39._14_2_ >> 5;
    auVar41._8_2_ = (ushort)((unkuint10)auVar50._0_10_ >> 0x45);
    auVar41._10_2_ = auVar50._10_2_ >> 5;
    auVar41._12_2_ = auVar51._12_2_ >> 5;
    auVar41._14_2_ = auVar60._14_2_ >> 5;
    auVar71 = psllw(auVar70,3);
    auVar32 = auVar41._0_15_ & auVar30._0_15_ | auVar61._0_15_;
    auVar62._0_2_ = auVar61._8_2_ >> 3;
    auVar62._2_2_ = auVar61._10_2_ >> 3;
    auVar62._4_2_ = auVar61._12_2_ >> 3;
    auVar62._6_2_ = auVar61._14_2_ >> 3;
    auVar62._8_8_ = 0;
    auVar62 = auVar62 | auVar71 & auVar31;
    auVar49._0_14_ = auVar32._0_14_;
    auVar49[0xe] = auVar32[7];
    auVar49[0xf] = auVar62[7];
    auVar48._14_2_ = auVar49._14_2_;
    auVar48._0_13_ = auVar32._0_13_;
    auVar48[0xd] = auVar62[6];
    auVar47._13_3_ = auVar48._13_3_;
    auVar47._0_12_ = auVar32._0_12_;
    auVar47[0xc] = auVar32[6];
    auVar46._12_4_ = auVar47._12_4_;
    auVar46._0_11_ = auVar32._0_11_;
    auVar46[0xb] = auVar62[5];
    auVar45._11_5_ = auVar46._11_5_;
    auVar45._0_10_ = auVar32._0_10_;
    auVar45[10] = auVar32[5];
    auVar44._10_6_ = auVar45._10_6_;
    auVar44._0_9_ = auVar32._0_9_;
    auVar44[9] = auVar62[4];
    auVar43._9_7_ = auVar44._9_7_;
    auVar43._0_8_ = auVar32._0_8_;
    auVar43[8] = auVar32[4];
    auVar42._8_8_ = auVar43._8_8_;
    auVar42[7] = auVar62[3];
    auVar42[6] = auVar32[3];
    auVar42[5] = auVar62[2];
    auVar42[4] = auVar32[2];
    auVar42[3] = auVar62[1];
    auVar42[2] = auVar32[1];
    auVar42[0] = auVar32[0];
    auVar42[1] = auVar62[0];
    *(undefined1 (*) [16])dst = auVar42;
    dst = (uint8_t *)((long)dst + 0x10);
  }
  if (num_pixels < 1) {
    return;
  }
  puVar14 = *(undefined1 (*) [16])src;
  for (; src < (undefined1 (*) [16])(puVar14 + (long)num_pixels * 4);
      src = (uint32_t *)(*(undefined1 (*) [16])src + 4)) {
    uVar2 = *(uint *)*(undefined1 (*) [16])src;
    (*(undefined1 (*) [16])dst)[0] = (byte)(uVar2 >> 0xd) & 7 | (byte)(uVar2 >> 0x10) & 0xf8;
    (*(undefined1 (*) [16])dst)[1] = (byte)(uVar2 >> 3) & 0x1f | (byte)(uVar2 >> 5) & 0xe0;
    dst = *(undefined1 (*) [16])dst + 2;
  }
  return;
}

Assistant:

static void ConvertBGRAToRGB565_SSE2(const uint32_t* src,
                                     int num_pixels, uint8_t* dst) {
  const __m128i mask_0xe0 = _mm_set1_epi8(0xe0);
  const __m128i mask_0xf8 = _mm_set1_epi8(0xf8);
  const __m128i mask_0x07 = _mm_set1_epi8(0x07);
  const __m128i* in = (const __m128i*)src;
  __m128i* out = (__m128i*)dst;
  while (num_pixels >= 8) {
    const __m128i bgra0 = _mm_loadu_si128(in++);     // bgra0|bgra1|bgra2|bgra3
    const __m128i bgra4 = _mm_loadu_si128(in++);     // bgra4|bgra5|bgra6|bgra7
    const __m128i v0l = _mm_unpacklo_epi8(bgra0, bgra4);  // b0b4g0g4r0r4a0a4...
    const __m128i v0h = _mm_unpackhi_epi8(bgra0, bgra4);  // b2b6g2g6r2r6a2a6...
    const __m128i v1l = _mm_unpacklo_epi8(v0l, v0h);      // b0b2b4b6g0g2g4g6...
    const __m128i v1h = _mm_unpackhi_epi8(v0l, v0h);      // b1b3b5b7g1g3g5g7...
    const __m128i v2l = _mm_unpacklo_epi8(v1l, v1h);      // b0...b7 | g0...g7
    const __m128i v2h = _mm_unpackhi_epi8(v1l, v1h);      // r0...r7 | a0...a7
    const __m128i ga0 = _mm_unpackhi_epi64(v2l, v2h);     // g0...g7 | a0...a7
    const __m128i rb0 = _mm_unpacklo_epi64(v2h, v2l);     // r0...r7 | b0...b7
    const __m128i rb1 = _mm_and_si128(rb0, mask_0xf8);    // -r0..-r7|-b0..-b7
    const __m128i g_lo1 = _mm_srli_epi16(ga0, 5);
    const __m128i g_lo2 = _mm_and_si128(g_lo1, mask_0x07);  // g0-...g7-|xx (3b)
    const __m128i g_hi1 = _mm_slli_epi16(ga0, 3);
    const __m128i g_hi2 = _mm_and_si128(g_hi1, mask_0xe0);  // -g0...-g7|xx (3b)
    const __m128i b0 = _mm_srli_si128(rb1, 8);              // -b0...-b7|0
    const __m128i rg1 = _mm_or_si128(rb1, g_lo2);           // gr0...gr7|xx
    const __m128i b1 = _mm_srli_epi16(b0, 3);
    const __m128i gb1 = _mm_or_si128(b1, g_hi2);            // bg0...bg7|xx
#if (WEBP_SWAP_16BIT_CSP == 1)
    const __m128i rgba = _mm_unpacklo_epi8(gb1, rg1);     // rggb0...rggb7
#else
    const __m128i rgba = _mm_unpacklo_epi8(rg1, gb1);     // bgrb0...bgrb7
#endif
    _mm_storeu_si128(out++, rgba);
    num_pixels -= 8;
  }
  // left-overs
  if (num_pixels > 0) {
    VP8LConvertBGRAToRGB565_C((const uint32_t*)in, num_pixels, (uint8_t*)out);
  }
}